

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_envelope_eval.cxx
# Opt level: O3

float bez2(xr_key *key0,xr_key *key1,float time)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  
  fVar1 = key0->time;
  if (key0->shape == '\x05') {
    fVar2 = key0->param[2];
    fVar4 = key1->time;
    fVar3 = fVar4 - fVar1;
  }
  else {
    fVar4 = key1->time;
    fVar3 = fVar4 - fVar1;
    fVar2 = fVar3 / 3.0;
  }
  fVar5 = ((fVar2 + fVar1) - fVar1) * 3.0;
  fVar2 = ((fVar4 + key1->param[0]) - (fVar2 + fVar1)) * 3.0 - fVar5;
  fVar4 = (fVar3 - fVar5) - fVar2;
  fVar6 = 0.25;
  fVar7 = 0.125;
  fVar3 = 0.5;
  fVar9 = fVar5 * 0.5 + fVar4 * 0.125 + fVar2 * 0.25 + fVar1;
  if (0.0001 < ABS(time - fVar9)) {
    fVar8 = 0.0;
    fVar3 = 0.5;
    fVar11 = 1.0;
    do {
      fVar10 = fVar3;
      if (fVar9 <= time) {
        fVar10 = fVar11;
      }
      fVar8 = (float)((uint)fVar8 & -(uint)(time < fVar9) | ~-(uint)(time < fVar9) & (uint)fVar3);
      fVar3 = (fVar10 - fVar8) * 0.5 + fVar8;
      fVar6 = fVar3 * fVar3;
      fVar7 = fVar3 * fVar6;
      fVar9 = fVar5 * fVar3 + fVar4 * fVar7 + fVar2 * fVar6 + fVar1;
      fVar11 = fVar10;
    } while (0.0001 < ABS(time - fVar9));
  }
  fVar1 = key0->value;
  if (key0->shape == '\x05') {
    fVar2 = key0->param[3];
  }
  else {
    fVar2 = key0->param[1] / 3.0;
  }
  fVar4 = ((fVar2 + fVar1) - fVar1) * 3.0;
  fVar2 = ((key1->param[1] + key1->value) - (fVar2 + fVar1)) * 3.0 - fVar4;
  return fVar4 * fVar3 + fVar6 * fVar2 + (((key1->value - fVar1) - fVar4) - fVar2) * fVar7 + fVar1;
}

Assistant:

static float bez2(const xr_key* key0, const xr_key* key1, float time)
{
	float x = (key0->shape == xr_key::SHAPE_BEZ2) ?
			key0->time + key0->param[2] :
			key0->time + (key1->time - key0->time)/3.f;
	float t0 = 0.f, t1 = 1.f;
	float t = bez2_time(key0->time, x, key1->time + key1->param[0], key1->time, time, &t0, &t1);

	float y = (key0->shape == xr_key::SHAPE_BEZ2) ?
			key0->value + key0->param[3] :
			key0->value + key0->param[1]/3.f;
	return bezier(key0->value, y, key1->param[1] + key1->value, key1->value, t);
}